

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  size_type sVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  ostream *this;
  size_t sVar8;
  long lVar9;
  long lVar10;
  char **ppcVar11;
  string *this_00;
  bool bVar12;
  int num_column;
  string input_data_type;
  DataTransformWrapper data_transform;
  string data_types;
  string print_format;
  string str;
  string output_data_type;
  ifstream ifs;
  int local_478;
  int local_474;
  char *local_470;
  WarningType local_464;
  string local_460;
  DataTransformWrapper local_440;
  undefined8 local_438;
  string local_430;
  undefined1 *local_410;
  long local_408;
  undefined1 local_400 [16];
  string local_3f0;
  string local_3d0 [3];
  ios_base local_360 [264];
  string local_258;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_474 = 1;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
  local_410 = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"da","");
  local_438 = 0;
  local_464 = kExit;
  local_478 = 0;
  do {
    iVar6 = ya_getopt_long(argc,argv,"re:c:f:h",(option *)0x0,(int *)0x0);
    sVar3 = local_3f0._M_string_length;
    pcVar1 = ya_optarg;
    switch(iVar6) {
    case 99:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d0);
      bVar12 = sptk::ConvertStringToInteger(&local_238,&local_474);
      bVar4 = 0 < local_474;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar12 && bVar4) goto LAB_0010ab4c;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -c option must be a positive integer",
                 0x39);
      local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"x2x","");
      sptk::PrintErrorMessage(local_3d0,(ostringstream *)&local_238);
LAB_0010aa08:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
        operator_delete(local_3d0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar6 = 1;
      local_478 = 1;
      break;
    case 100:
    case 0x67:
switchD_0010a7b2_caseD_64:
      iVar6 = 1;
      anon_unknown.dwarf_21a7::PrintUsage((ostream *)&std::cerr);
      local_478 = 1;
      break;
    case 0x65:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d0);
      bVar4 = sptk::ConvertStringToInteger(&local_238,(int *)&local_460);
      if (bVar4) {
        bVar4 = sptk::IsInRange((WarningType)local_460._M_dataplus._M_p,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (!bVar4) goto LAB_0010aa74;
        iVar6 = 4;
        bVar4 = true;
        local_464 = (WarningType)local_460._M_dataplus._M_p;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
LAB_0010aa74:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -e option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        this = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
        std::ostream::operator<<((ostream *)this,2);
        local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"x2x","");
        sptk::PrintErrorMessage(local_3d0,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
          operator_delete(local_3d0[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar6 = 1;
        bVar4 = false;
        local_478 = 1;
      }
      if (bVar4) goto LAB_0010ab4c;
      break;
    case 0x66:
      strlen(ya_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_3f0,0,(char *)sVar3,(ulong)pcVar1);
      std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_3f0);
      iVar6 = std::__cxx11::string::compare((char *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (iVar6 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -f option must be begin with %",0x33)
        ;
        local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"x2x","");
        sptk::PrintErrorMessage(local_3d0,(ostringstream *)&local_238);
        goto LAB_0010aa08;
      }
LAB_0010ab4c:
      iVar6 = 0;
      break;
    case 0x68:
      anon_unknown.dwarf_21a7::PrintUsage((ostream *)&std::cout);
      local_478 = 0;
      iVar6 = 1;
      break;
    default:
      if (iVar6 != -1) {
        if (iVar6 == 0x72) {
          local_438 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
          goto LAB_0010ab4c;
        }
        goto switchD_0010a7b2_caseD_64;
      }
      iVar6 = 2;
    }
  } while (iVar6 == 0);
  if (iVar6 != 2) goto LAB_0010b148;
  bVar4 = argc - ya_optind < 1;
  uVar7 = argc - ya_optind;
  if (uVar7 == 0 || argc < ya_optind) {
    local_470 = (char *)0x0;
  }
  else {
    ppcVar11 = argv + ((long)argc - (ulong)uVar7);
    local_470 = (char *)0x0;
    lVar9 = (ulong)uVar7 + 1;
    do {
      pcVar1 = *ppcVar11;
      if (*pcVar1 == '+') {
        local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
        sVar8 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,pcVar1,pcVar1 + sVar8);
        std::__cxx11::string::substr((ulong)&local_238,(ulong)local_3d0);
        std::__cxx11::string::operator=((string *)&local_410,(string *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        bVar12 = local_408 == 2;
        if (!bVar12) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"The +type option must be two characters",0x27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"x2x","");
          sptk::PrintErrorMessage(&local_460,(ostringstream *)&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
          std::ios_base::~ios_base(local_1c8);
          local_478 = 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
          operator_delete(local_3d0[0]._M_dataplus._M_p);
        }
      }
      else if (local_470 == (char *)0x0) {
        bVar12 = true;
        local_470 = pcVar1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"x2x","");
        sptk::PrintErrorMessage(local_3d0,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
          operator_delete(local_3d0[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        local_478 = 1;
        bVar12 = false;
      }
      if (!bVar12) break;
      lVar10 = lVar9 + -1;
      ppcVar11 = ppcVar11 + 1;
      lVar2 = lVar9 + -3;
      bVar4 = lVar10 < 2;
      lVar9 = lVar10;
    } while (SBORROW8(lVar10,2) == lVar2 < 0);
  }
  if (!bVar4) goto LAB_0010b148;
  bVar4 = sptk::SetBinaryMode();
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"x2x","");
    sptk::PrintErrorMessage(local_3d0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    local_478 = 1;
    goto LAB_0010b148;
  }
  this_00 = &local_238;
  std::ifstream::ifstream(this_00);
  if ((local_470 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_470),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      this_00 = (string *)&std::cin;
    }
    std::__cxx11::string::substr((ulong)&local_460,(ulong)&local_410);
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_410);
    anon_unknown.dwarf_21a7::DataTransformWrapper::DataTransformWrapper
              (&local_440,&local_460,&local_258,&local_3f0,local_474,local_464,
               (bool)((byte)local_438 & 1));
    if (local_440.data_transform_ == (DataTransformInterface *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d0,"Unexpected argument for the +type option",0x28);
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"x2x","");
      sptk::PrintErrorMessage(&local_430,(ostringstream *)local_3d0);
LAB_0010b0cd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
      std::ios_base::~ios_base(local_360);
      local_478 = 1;
    }
    else {
      iVar6 = (*(local_440.data_transform_)->_vptr_DataTransformInterface[2])
                        (local_440.data_transform_,this_00);
      local_478 = 0;
      if ((char)iVar6 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,"Failed to transform",0x13);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"x2x","");
        sptk::PrintErrorMessage(&local_430,(ostringstream *)local_3d0);
        goto LAB_0010b0cd;
      }
    }
    if (local_440.data_transform_ != (DataTransformInterface *)0x0) {
      (*(local_440.data_transform_)->_vptr_DataTransformInterface[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d0,"Cannot open file ",0x11);
    pcVar1 = local_470;
    sVar8 = strlen(local_470);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar1,sVar8);
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"x2x","");
    sptk::PrintErrorMessage(&local_460,(ostringstream *)local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    std::ios_base::~ios_base(local_360);
    local_478 = 1;
  }
  std::ifstream::~ifstream(&local_238);
LAB_0010b148:
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  return local_478;
}

Assistant:

int main(int argc, char* argv[]) {
  bool rounding_flag(kDefaultRoundingFlag);
  WarningType warning_type(kDefaultWarningType);
  int num_column(kDefaultNumColumn);
  std::string print_format("");
  std::string data_types(kDefaultDataTypes);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "re:c:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'r': {
        rounding_flag = true;
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be begin with %";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_types = str.substr(1, std::string::npos);
      if (2 != data_types.size()) {
        std::ostringstream error_message;
        error_message << "The +type option must be two characters";
        sptk::PrintErrorMessage("x2x", error_message);
        return 1;
      }
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const std::string input_data_type(data_types.substr(0, 1));
  const std::string output_data_type(data_types.substr(1, 1));
  DataTransformWrapper data_transform(input_data_type, output_data_type,
                                      print_format, num_column, warning_type,
                                      rounding_flag);

  if (!data_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  if (!data_transform.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to transform";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  return 0;
}